

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::ShaderSubroutine::FunctionalTest13::getFragmentShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest13 *this,uint n_id)

{
  ostream *poVar1;
  stringstream result_sstream;
  stringstream local_198 [16];
  ostream local_188;
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(&local_188,
                           "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nsubroutine void SubroutineFSType(inout vec4 result);\n\nsubroutine(SubroutineFSType) void SubroutineFS1(inout vec4 result)\n{\n    result += vec4("
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)(n_id + 1) / 10.0);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)(n_id + 2) / 10.0);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)(n_id + 3) / 10.0);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)(n_id + 4) / 10.0);
  poVar1 = std::operator<<(poVar1,
                           ");\n}\nsubroutine(SubroutineFSType) void SubroutineFS2(inout vec4 result)\n{\n    result += vec4("
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)(n_id + 1) / 20.0);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)(n_id + 2) / 20.0);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)(n_id + 3) / 20.0);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)(n_id + 4) / 20.0);
  std::operator<<(poVar1,
                  ");\n}\n\nsubroutine uniform SubroutineFSType function;\n\nin GS_DATA\n{\n    vec4 data;\n} in_gs;\n\nout vec4 result;\nvoid main()\n{\n    vec4 data = in_gs.data;\n    function(data);\n\n    result = data;\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionalTest13::getFragmentShaderBody(unsigned int n_id)
{
	std::stringstream result_sstream;

	/* Pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n"
					  "\n"
					  /* Sub-routine */
					  "subroutine void SubroutineFSType(inout vec4 result);\n"
					  "\n"
					  "subroutine(SubroutineFSType) void SubroutineFS1(inout vec4 result)\n"
					  "{\n"
					  "    result += vec4("
				   << float(n_id + 1) / 10.0f << ", " << float(n_id + 2) / 10.0f << ", " << float(n_id + 3) / 10.0f
				   << ", " << float(n_id + 4) / 10.0f
				   << ");\n"
					  "}\n"
					  "subroutine(SubroutineFSType) void SubroutineFS2(inout vec4 result)\n"
					  "{\n"
					  "    result += vec4("
				   << float(n_id + 1) / 20.0f << ", " << float(n_id + 2) / 20.0f << ", " << float(n_id + 3) / 20.0f
				   << ", " << float(n_id + 4) / 20.0f << ");\n"
														 "}\n"
														 "\n"
														 "subroutine uniform SubroutineFSType function;\n"
														 "\n"
														 /* Input block */
														 "in GS_DATA\n"
														 "{\n"
														 "    vec4 data;\n"
														 "} in_gs;\n"
														 "\n"
														 "out vec4 result;\n"
														 /* main() declaration */
														 "void main()\n"
														 "{\n"
														 "    vec4 data = in_gs.data;\n"
														 "    function(data);\n"
														 "\n"
														 "    result = data;\n"
														 "}\n";

	return result_sstream.str();
}